

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_info.cc
# Opt level: O0

void __thiscall
bloaty::dwarf::LineInfoReader::SeekToOffset
          (LineInfoReader *this,uint64_t offset,uint8_t address_size)

{
  pointer puVar1;
  uchar uVar2;
  uint8_t uVar3;
  char cVar4;
  bool bVar5;
  reference pvVar6;
  ulong uVar7;
  size_type sVar8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  FileName file_name;
  string_view dir;
  size_t i;
  string_view program;
  uint64_t header_length;
  string_view data;
  value_type *in_stack_fffffffffffffed8;
  string_view *in_stack_fffffffffffffee0;
  string_view *in_stack_fffffffffffffee8;
  value_type *__x;
  string_view *in_stack_fffffffffffffef0;
  string_view *data_00;
  undefined7 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffeff;
  undefined1 local_f8 [16];
  pointer local_e8;
  undefined4 local_e0;
  undefined2 local_dc;
  uint8_t local_da;
  string_view local_d8;
  basic_string_view<char,_std::char_traits<char>_> local_c8;
  uint local_b8;
  unsigned_long local_b0;
  undefined8 in_stack_ffffffffffffff58;
  CompilationUnitSizes *in_stack_ffffffffffffff60;
  string_view local_78;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  ulong local_58;
  pointer local_50;
  pointer local_48;
  uint64_t local_40;
  string_view local_38;
  pointer local_28;
  pointer local_20;
  
  uVar3 = (uint8_t)((ulong)in_stack_ffffffffffffff58 >> 0x38);
  puVar1 = (in_RDI->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_28 = *(pointer *)(puVar1 + 0x40);
  local_20 = *(pointer *)(puVar1 + 0x48);
  SkipBytes((size_t)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  CompilationUnitSizes::SetAddressSize(in_stack_ffffffffffffff60,uVar3);
  local_38 = CompilationUnitSizes::ReadInitialLength
                       ((CompilationUnitSizes *)
                        CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8),
                        in_stack_fffffffffffffef0);
  local_28 = (pointer)local_38._M_len;
  local_20 = (pointer)local_38._M_str;
  CompilationUnitSizes::ReadDWARFVersion
            ((CompilationUnitSizes *)in_stack_fffffffffffffee0,&in_stack_fffffffffffffed8->name);
  local_40 = CompilationUnitSizes::ReadDWARFOffset
                       ((CompilationUnitSizes *)in_stack_fffffffffffffee0,
                        &in_stack_fffffffffffffed8->name);
  local_50 = local_28;
  local_48 = local_20;
  SkipBytes((size_t)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  uVar2 = ReadFixed<unsigned_char,1ul>(in_stack_fffffffffffffee0);
  *(uchar *)&(in_RDI->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start = uVar2;
  uVar3 = CompilationUnitSizes::dwarf_version
                    ((CompilationUnitSizes *)
                     &(in_RDI->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (uVar3 == '\x04') {
    uVar2 = ReadFixed<unsigned_char,1ul>(in_stack_fffffffffffffee0);
    *(uchar *)((long)&(in_RDI->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_start + 1) = uVar2;
    if (*(char *)((long)&(in_RDI->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                         ._M_impl.super__Vector_impl_data._M_start + 1) == '\0') {
      Throw((char *)in_stack_fffffffffffffef0,(int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
    }
  }
  else {
    *(undefined1 *)
     ((long)&(in_RDI->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start + 1) = 1;
  }
  uVar2 = ReadFixed<unsigned_char,1ul>(in_stack_fffffffffffffee0);
  *(uchar *)((long)&(in_RDI->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_start + 2) = uVar2;
  cVar4 = ReadFixed<signed_char,1ul>(in_stack_fffffffffffffee0);
  *(char *)((long)&(in_RDI->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start + 3) = cVar4;
  uVar2 = ReadFixed<unsigned_char,1ul>(in_stack_fffffffffffffee0);
  *(uchar *)((long)&(in_RDI->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_start + 4) = uVar2;
  uVar2 = ReadFixed<unsigned_char,1ul>(in_stack_fffffffffffffee0);
  *(uchar *)((long)&(in_RDI->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_start + 5) = uVar2;
  if (*(char *)((long)&(in_RDI->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_start + 4) != '\0') {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (in_RDI,CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
    for (local_58 = 1;
        local_58 <
        *(byte *)((long)&(in_RDI->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                         ._M_impl.super__Vector_impl_data._M_start + 5); local_58 = local_58 + 1) {
      uVar2 = ReadFixed<unsigned_char,1ul>(in_stack_fffffffffffffee0);
      pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (in_RDI + 3,local_58);
      *pvVar6 = uVar2;
    }
    std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::clear((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             *)0x20fd04);
    data_00 = (string_view *)(in_RDI + 1);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_68);
    std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::push_back((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 *)in_stack_fffffffffffffee0,&in_stack_fffffffffffffed8->name);
    while( true ) {
      local_78 = ReadNullTerminated((string_view *)0x20fd3e);
      bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_78);
      if (bVar5) break;
      std::
      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::push_back((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *)data_00,in_stack_fffffffffffffee8);
    }
    std::
    vector<bloaty::dwarf::LineInfoReader::FileName,_std::allocator<bloaty::dwarf::LineInfoReader::FileName>_>
    ::clear((vector<bloaty::dwarf::LineInfoReader::FileName,_std::allocator<bloaty::dwarf::LineInfoReader::FileName>_>
             *)0x20fd89);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x20fd97);
    __x = (value_type *)(in_RDI + 2);
    memset(&stack0xffffffffffffff60,0,0x28);
    FileName::FileName((FileName *)0x20fdc6);
    std::
    vector<bloaty::dwarf::LineInfoReader::FileName,_std::allocator<bloaty::dwarf::LineInfoReader::FileName>_>
    ::push_back((vector<bloaty::dwarf::LineInfoReader::FileName,_std::allocator<bloaty::dwarf::LineInfoReader::FileName>_>
                 *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    while( true ) {
      FileName::FileName((FileName *)0x20fde2);
      local_d8 = ReadNullTerminated((string_view *)0x20fdef);
      local_c8._M_len = local_d8._M_len;
      local_c8._M_str = local_d8._M_str;
      bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_c8);
      if (bVar5) {
        LineInfo::LineInfo((LineInfo *)local_f8,
                           *(char *)((long)&(in_RDI->
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            )._M_impl.super__Vector_impl_data._M_start + 2) != '\0')
        ;
        in_RDI[6].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_f8._0_8_;
        in_RDI[6].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)local_f8._8_8_;
        in_RDI[6].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = local_e8;
        *(undefined4 *)
         &in_RDI[7].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = local_e0;
        *(undefined2 *)
         ((long)&in_RDI[7].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start + 4) = local_dc;
        *(uint8_t *)
         ((long)&in_RDI[7].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start + 6) = local_da;
        in_RDI[5].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = local_50;
        in_RDI[5].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = local_48;
        *(undefined1 *)
         &in_RDI[5].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = 0;
        return;
      }
      local_b8 = ReadLEB128<unsigned_int>(data_00);
      local_b0 = ReadLEB128<unsigned_long>(data_00);
      ReadLEB128<unsigned_long>(data_00);
      uVar7 = (ulong)local_b8;
      sVar8 = std::
              vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ::size((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      *)(in_RDI + 1));
      if (sVar8 <= uVar7) break;
      std::
      vector<bloaty::dwarf::LineInfoReader::FileName,_std::allocator<bloaty::dwarf::LineInfoReader::FileName>_>
      ::push_back((vector<bloaty::dwarf::LineInfoReader::FileName,_std::allocator<bloaty::dwarf::LineInfoReader::FileName>_>
                   *)data_00,__x);
    }
    Throw((char *)data_00,(int)((ulong)__x >> 0x20));
  }
  Throw((char *)in_stack_fffffffffffffef0,(int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
}

Assistant:

void LineInfoReader::SeekToOffset(uint64_t offset, uint8_t address_size) {
  string_view data = file_.debug_line;
  SkipBytes(offset, &data);

  sizes_.SetAddressSize(address_size);
  data = sizes_.ReadInitialLength(&data);
  sizes_.ReadDWARFVersion(&data);
  uint64_t header_length = sizes_.ReadDWARFOffset(&data);
  string_view program = data;
  SkipBytes(header_length, &program);

  params_.minimum_instruction_length = ReadFixed<uint8_t>(&data);
  if (sizes_.dwarf_version() == 4) {
    params_.maximum_operations_per_instruction = ReadFixed<uint8_t>(&data);

    if (params_.maximum_operations_per_instruction == 0) {
      THROW("DWARF line info had maximum_operations_per_instruction=0");
    }
  } else {
    params_.maximum_operations_per_instruction = 1;
  }
  params_.default_is_stmt = ReadFixed<uint8_t>(&data);
  params_.line_base = ReadFixed<int8_t>(&data);
  params_.line_range = ReadFixed<uint8_t>(&data);
  params_.opcode_base = ReadFixed<uint8_t>(&data);
  if (params_.line_range == 0) {
    THROW("line_range of zero will cause divide by zero");
  }

  standard_opcode_lengths_.resize(params_.opcode_base);
  for (size_t i = 1; i < params_.opcode_base; i++) {
    standard_opcode_lengths_[i] = ReadFixed<uint8_t>(&data);
  }

  // Read include_directories.
  include_directories_.clear();

  // Implicit current directory entry.
  include_directories_.push_back(string_view());

  while (true) {
    string_view dir = ReadNullTerminated(&data);
    if (dir.empty()) {
      break;
    }
    include_directories_.push_back(dir);
  }

  // Read file_names.
  filenames_.clear();
  expanded_filenames_.clear();

  // Filename 0 is unused.
  filenames_.push_back(FileName());
  while (true) {
    FileName file_name;
    file_name.name = ReadNullTerminated(&data);
    if (file_name.name.empty()) {
      break;
    }
    file_name.directory_index = ReadLEB128<uint32_t>(&data);
    file_name.modified_time = ReadLEB128<uint64_t>(&data);
    file_name.file_size = ReadLEB128<uint64_t>(&data);
    if (file_name.directory_index >= include_directories_.size()) {
      THROW("directory index out of range");
    }
    filenames_.push_back(file_name);
  }

  info_ = LineInfo(params_.default_is_stmt);
  remaining_ = program;
  shadow_ = false;
}